

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modified.cpp
# Opt level: O3

void __thiscall modified::restore(modified *this)

{
  int iVar1;
  branch_and_reduce_algorithm *pbVar2;
  int *piVar3;
  pointer piVar4;
  pointer piVar5;
  iterator __begin1;
  int *piVar6;
  pointer piVar7;
  pointer pvVar8;
  iterator __end1;
  int iVar9;
  int iVar10;
  long lVar11;
  
  pbVar2 = this->pAlg;
  pbVar2->crt = pbVar2->crt - this->add;
  piVar6 = (this->removed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->removed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pbVar2->rn = pbVar2->rn + (int)((ulong)((long)piVar3 - (long)piVar6) >> 2);
  if (piVar3 != piVar6) {
    piVar7 = (pbVar2->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar7[*piVar6] = -1;
      piVar6 = piVar6 + 1;
    } while (piVar6 != piVar3);
  }
  piVar7 = (this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (0 < (int)((ulong)((long)(this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar7) >> 2)) {
    pvVar8 = (pbVar2->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::operator=
                (pvVar8 + piVar7[lVar11],
                 (this->oldAdj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar11);
      piVar7 = (this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pbVar2 = this->pAlg;
      iVar1 = piVar7[lVar11];
      pvVar8 = (pbVar2->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar4 = (pbVar2->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (pbVar2->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = piVar5[iVar1];
      iVar10 = piVar4[iVar1];
      for (piVar6 = pvVar8[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar6 != *(pointer *)
                     ((long)&pvVar8[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8); piVar6 = piVar6 + 1) {
        if (*piVar6 == iVar10) {
          iVar10 = -1;
        }
        if (*piVar6 == iVar9) {
          iVar9 = -1;
        }
      }
      if (-1 < iVar10) {
        piVar5[piVar4[iVar1]] = -1;
        piVar4[piVar7[lVar11]] = -1;
      }
      if (-1 < iVar9) {
        piVar4[piVar5[piVar7[lVar11]]] = -1;
        piVar5[piVar7[lVar11]] = -1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)((ulong)((long)(this->vs).super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar7)
                           >> 2));
  }
  return;
}

Assistant:

void modified::restore() {
    pAlg->crt -= add;
    pAlg->rn += removed.size();
    for (int v : removed) pAlg->x[v] = -1;
    for (int i = 0; i < static_cast<int>(vs.size()); i++) {
        pAlg->adj[vs[i]] = oldAdj[i];
        int inV = pAlg->in[vs[i]], outV = pAlg->out[vs[i]];
        for (int u : pAlg->adj[vs[i]]) {
            if (u == inV) inV = -1;
            if (u == outV) outV = -1;
        }
        if (inV >= 0) {
            pAlg->out[pAlg->in[vs[i]]] = -1;
            pAlg->in[vs[i]] = -1;
        }
        if (outV >= 0) {
            pAlg->in[pAlg->out[vs[i]]] = -1;
            pAlg->out[vs[i]] = -1;
        }
    }
}